

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

DeviceInfo * __thiscall
RtApi::getDeviceInfo(DeviceInfo *__return_storage_ptr__,RtApi *this,uint deviceId)

{
  size_type sVar1;
  reference pvVar2;
  uint local_20;
  uint m;
  uint deviceId_local;
  RtApi *this_local;
  
  sVar1 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                    (&this->deviceList_);
  if (sVar1 == 0) {
    (*this->_vptr_RtApi[0xb])();
  }
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                      (&this->deviceList_);
    if (sVar1 <= local_20) {
      std::__cxx11::string::operator=
                ((string *)&this->errorText_,"RtApi::getDeviceInfo: deviceId argument not found.");
      error(this,RTAUDIO_INVALID_PARAMETER);
      memset(__return_storage_ptr__,0,0x60);
      RtAudio::DeviceInfo::DeviceInfo(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                       (&this->deviceList_,(ulong)local_20);
    if (pvVar2->ID == deviceId) break;
    local_20 = local_20 + 1;
  }
  pvVar2 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                     (&this->deviceList_,(ulong)local_20);
  RtAudio::DeviceInfo::DeviceInfo(__return_storage_ptr__,pvVar2);
  return __return_storage_ptr__;
}

Assistant:

RtAudio::DeviceInfo RtApi :: getDeviceInfo( unsigned int deviceId )
{
  if ( deviceList_.size() == 0 ) probeDevices();
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId )
      return deviceList_[m];
  }

  errorText_ = "RtApi::getDeviceInfo: deviceId argument not found.";
  error( RTAUDIO_INVALID_PARAMETER );
  return RtAudio::DeviceInfo();
}